

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdGetConfidentialTxIn
              (void *handle,char *tx_hex_string,uint32_t index,char **txid,uint32_t *vout,
              uint32_t *sequence,char **script_sig)

{
  bool bVar1;
  ConfidentialTransaction *this;
  CfdException *this_00;
  char *work_script_sig;
  ConfidentialTransactionController ctxc;
  ConfidentialTxInReference ref;
  char *local_248;
  char *local_240;
  undefined1 local_238 [32];
  Script local_218;
  ConfidentialTransactionController local_1e0;
  ConfidentialTxInReference local_190;
  
  local_240 = (char *)0x0;
  local_248 = (char *)0x0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_190,tx_hex_string,(allocator *)&local_218);
    cfd::ConfidentialTransactionController::ConfidentialTransactionController
              (&local_1e0,(string *)&local_190);
    if ((ByteData *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference !=
        &local_190.super_AbstractTxInReference.txid_.data_) {
      operator_delete(local_190.super_AbstractTxInReference._vptr_AbstractTxInReference);
    }
    this = cfd::ConfidentialTransactionController::GetTransaction(&local_1e0);
    cfd::core::ConfidentialTransaction::GetTxIn(&local_190,this,index);
    if (txid != (char **)0x0) {
      cfd::core::Txid::Txid((Txid *)local_238,&local_190.super_AbstractTxInReference.txid_);
      cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_218,(Txid *)local_238);
      local_240 = cfd::capi::CreateString((string *)&local_218);
      if (local_218._vptr_Script !=
          (_func_int **)
          ((long)&local_218.script_data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_218._vptr_Script);
      }
      local_238._0_8_ = &PTR__Txid_00735400;
      if ((pointer)local_238._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_238._8_8_);
      }
    }
    if (vout != (uint32_t *)0x0) {
      *vout = local_190.super_AbstractTxInReference.vout_;
    }
    if (sequence != (uint32_t *)0x0) {
      *sequence = local_190.super_AbstractTxInReference.sequence_;
    }
    if (script_sig != (char **)0x0) {
      cfd::core::Script::Script(&local_218,&local_190.super_AbstractTxInReference.unlocking_script_)
      ;
      cfd::core::Script::GetHex_abi_cxx11_((string *)local_238,&local_218);
      local_248 = cfd::capi::CreateString((string *)local_238);
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_);
      }
      cfd::core::Script::~Script(&local_218);
    }
    if (local_240 != (char *)0x0) {
      *txid = local_240;
    }
    if (local_248 != (char *)0x0) {
      *script_sig = local_248;
    }
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
    local_1e0.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&PTR__ConfidentialTransactionController_00735388;
    cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_1e0.transaction_);
    return 0;
  }
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)0x5f3c92;
  local_190.super_AbstractTxInReference.txid_._vptr_Txid._0_4_ = 0x1cc;
  local_190.super_AbstractTxInReference.txid_.data_.data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = "CfdGetConfidentialTxIn";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_190,kCfdLogLevelWarning,"tx is null or empty.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference =
       (_func_int **)&local_190.super_AbstractTxInReference.txid_.data_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_190);
  __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetConfidentialTxIn(
    void* handle, const char* tx_hex_string, uint32_t index, char** txid,
    uint32_t* vout, uint32_t* sequence, char** script_sig) {
  char* work_txid = nullptr;
  char* work_script_sig = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex_string);
    const ConfidentialTransaction& tx = ctxc.GetTransaction();
    const ConfidentialTxInReference ref = tx.GetTxIn(index);

    if (txid != nullptr) {
      work_txid = CreateString(ref.GetTxid().GetHex());
    }
    if (vout != nullptr) {
      *vout = ref.GetVout();
    }
    if (sequence != nullptr) {
      *sequence = ref.GetSequence();
    }
    if (script_sig != nullptr) {
      work_script_sig = CreateString(ref.GetUnlockingScript().GetHex());
    }

    if (work_txid != nullptr) *txid = work_txid;
    if (work_script_sig != nullptr) *script_sig = work_script_sig;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_txid, &work_script_sig);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_txid, &work_script_sig);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_txid, &work_script_sig);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}